

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::SCAtomTypesSectionParser::SCAtomTypesSectionParser
          (SCAtomTypesSectionParser *this,ForceFieldOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  SectionParser *this_00;
  allocator<char> local_31;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  SectionParser::SectionParser((SectionParser *)0x24b54c);
  *(undefined ***)in_RDI = &PTR__SCAtomTypesSectionParser_00396f48;
  in_RDI[1]._M_string_length = (size_type)in_RSI;
  this_00 = (SectionParser *)&local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  SectionParser::setSectionName(this_00,in_RDI);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

SCAtomTypesSectionParser::SCAtomTypesSectionParser(
      ForceFieldOptions& options) :
      options_(options) {
    setSectionName("SCAtomTypes");
  }